

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O3

void av1_compute_stats_highbd_c
               (int wiener_win,uint8_t *dgd8,uint8_t *src8,int16_t *dgd_avg,int16_t *src_avg,
               int h_start,int h_end,int v_start,int v_end,int dgd_stride,int src_stride,int64_t *M,
               int64_t *H,aom_bit_depth_t bit_depth)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  ushort *puVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t *piVar10;
  long *plVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ushort *puVar16;
  long lVar17;
  ulong uVar18;
  long *plVar19;
  ulong uVar20;
  ushort *puVar21;
  int32_t Y [49];
  long local_160;
  ushort *local_148;
  int local_f8 [50];
  
  uVar6 = wiener_win * wiener_win;
  if (v_start < v_end) {
    lVar5 = (long)v_start;
    lVar13 = (long)dgd8 * 2 + dgd_stride * lVar5 * 2;
    uVar9 = 0;
    do {
      lVar15 = (long)h_start;
      if (h_start < h_end) {
        do {
          uVar9 = uVar9 + *(ushort *)(lVar13 + lVar15 * 2);
          lVar15 = lVar15 + 1;
        } while (h_end != lVar15);
      }
      lVar5 = lVar5 + 1;
      lVar13 = lVar13 + (long)dgd_stride * 2;
    } while (lVar5 != v_end);
  }
  else {
    uVar9 = 0;
  }
  lVar13 = 0x10;
  if (bit_depth != AOM_BITS_12) {
    lVar13 = (ulong)(bit_depth == AOM_BITS_10) * 3 + 1;
  }
  uVar20 = (ulong)uVar6;
  memset(M,0,uVar20 * 8);
  memset(H,0,uVar20 * 8 * uVar20);
  if (v_end - v_start != 0 && v_start <= v_end) {
    iVar14 = wiener_win >> 1;
    uVar9 = uVar9 / (ulong)(long)((v_end - v_start) * (h_end - h_start));
    lVar5 = (long)dgd_stride;
    local_160 = (long)v_start;
    puVar21 = (ushort *)
              ((long)dgd8 * 2 +
              (long)h_start * 2 + (local_160 - iVar14) * lVar5 * 2 + (long)iVar14 * -2);
    do {
      if (h_start < h_end) {
        lVar15 = (long)h_start;
        local_148 = puVar21;
        do {
          uVar2 = *(ushort *)((long)src8 * 2 + local_160 * src_stride * 2 + lVar15 * 2);
          if (iVar14 < 0) {
LAB_00201c5c:
            piVar4 = local_f8;
            uVar18 = 0;
            piVar10 = H;
            do {
              iVar3 = local_f8[uVar18];
              M[uVar18] = M[uVar18] + (long)iVar3 * ((ulong)uVar2 - (uVar9 & 0xffff));
              lVar17 = 0;
              do {
                piVar10[lVar17] = piVar10[lVar17] + (long)piVar4[lVar17] * (long)iVar3;
                lVar1 = uVar18 + lVar17;
                lVar17 = lVar17 + 1;
              } while (lVar1 + 1U < uVar20);
              uVar18 = uVar18 + 1;
              piVar10 = piVar10 + uVar20 + 1;
              piVar4 = piVar4 + 1;
            } while (uVar18 != uVar6 + (uVar6 == 0));
          }
          else {
            lVar17 = 0;
            puVar7 = local_148;
            iVar3 = -iVar14;
            do {
              lVar17 = (long)(int)lVar17;
              puVar16 = puVar7;
              iVar12 = iVar14 * 2 + 1;
              do {
                local_f8[lVar17] = (uint)*puVar16 - (uint)(ushort)uVar9;
                lVar17 = lVar17 + 1;
                puVar16 = puVar16 + lVar5;
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
              iVar3 = iVar3 + 1;
              puVar7 = puVar7 + 1;
            } while (iVar14 + 1 != iVar3);
            if (wiener_win != 0) goto LAB_00201c5c;
          }
          lVar15 = lVar15 + 1;
          local_148 = local_148 + 1;
        } while (lVar15 != h_end);
      }
      local_160 = local_160 + 1;
      puVar21 = puVar21 + lVar5;
    } while (local_160 != v_end);
  }
  if (wiener_win != 0) {
    piVar10 = H + 1;
    plVar11 = H + uVar20;
    uVar18 = 0;
    uVar9 = uVar20;
    do {
      uVar9 = uVar9 - 1;
      M[uVar18] = M[uVar18] / lVar13;
      uVar8 = (ulong)(uVar6 * (int)uVar18);
      H[uVar18 + uVar8] = H[uVar18 + uVar8] / lVar13;
      uVar18 = uVar18 + 1;
      if (uVar18 < uVar20) {
        uVar8 = 0;
        plVar19 = plVar11;
        do {
          lVar5 = piVar10[uVar8];
          piVar10[uVar8] = lVar5 / lVar13;
          *plVar19 = lVar5 / lVar13;
          uVar8 = uVar8 + 1;
          plVar19 = plVar19 + uVar20;
        } while (uVar9 != uVar8);
      }
      piVar10 = piVar10 + uVar20 + 1;
      plVar11 = plVar11 + uVar20 + 1;
    } while (uVar18 != uVar6 + (uVar6 == 0));
  }
  return;
}

Assistant:

void av1_compute_stats_highbd_c(int wiener_win, const uint8_t *dgd8,
                                const uint8_t *src8, int16_t *dgd_avg,
                                int16_t *src_avg, int h_start, int h_end,
                                int v_start, int v_end, int dgd_stride,
                                int src_stride, int64_t *M, int64_t *H,
                                aom_bit_depth_t bit_depth) {
  (void)dgd_avg;
  (void)src_avg;
  int i, j, k, l;
  int32_t Y[WIENER_WIN2];
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  memset(M, 0, sizeof(*M) * wiener_win2);
  memset(H, 0, sizeof(*H) * wiener_win2 * wiener_win2);
  for (i = v_start; i < v_end; i++) {
    for (j = h_start; j < h_end; j++) {
      const int32_t X = (int32_t)src[i * src_stride + j] - (int32_t)avg;
      int idx = 0;
      for (k = -wiener_halfwin; k <= wiener_halfwin; k++) {
        for (l = -wiener_halfwin; l <= wiener_halfwin; l++) {
          Y[idx] = (int32_t)dgd[(i + l) * dgd_stride + (j + k)] - (int32_t)avg;
          idx++;
        }
      }
      assert(idx == wiener_win2);
      for (k = 0; k < wiener_win2; ++k) {
        M[k] += (int64_t)Y[k] * X;
        for (l = k; l < wiener_win2; ++l) {
          // H is a symmetric matrix, so we only need to fill out the upper
          // triangle here. We can copy it down to the lower triangle outside
          // the (i, j) loops.
          H[k * wiener_win2 + l] += (int64_t)Y[k] * Y[l];
        }
      }
    }
  }
  for (k = 0; k < wiener_win2; ++k) {
    M[k] /= bit_depth_divider;
    H[k * wiener_win2 + k] /= bit_depth_divider;
    for (l = k + 1; l < wiener_win2; ++l) {
      H[k * wiener_win2 + l] /= bit_depth_divider;
      H[l * wiener_win2 + k] = H[k * wiener_win2 + l];
    }
  }
}